

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

string * GetTargetPropertyOrDefault
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *property,
                   string *defaultValue)

{
  bool bVar1;
  string *psVar2;
  cmValue local_30;
  cmValue name;
  string *defaultValue_local;
  string *property_local;
  cmGeneratorTarget *target_local;
  
  name.Value = defaultValue;
  local_30 = cmGeneratorTarget::GetProperty(target,property);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultValue);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetTargetPropertyOrDefault(cmGeneratorTarget const* target,
                                              std::string const& property,
                                              std::string defaultValue)
{
  if (cmValue name = target->GetProperty(property)) {
    return *name;
  }
  return defaultValue;
}